

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IFF_Layer2::IFF_Layer2(IFF_Layer2 *this)

{
  IFF_Layer2 *this_local;
  
  LayerHeader::LayerHeader(&this->super_LayerHeader);
  (this->super_LayerHeader).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer2_0032e628;
  BeamData::BeamData(&this->m_BmDt);
  SecondaryOperationalData::SecondaryOperationalData(&this->m_SOD);
  std::
  vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
  ::vector(&this->m_vFPD);
  (this->super_LayerHeader).m_ui8LayerNumber = '\x02';
  (this->super_LayerHeader).m_ui16LayerLength = 0x1c;
  return;
}

Assistant:

IFF_Layer2::IFF_Layer2()     
{
	m_ui8LayerNumber = 2;
	m_ui16LayerLength = IFF_LAYER2_SIZE;
}